

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime_abi_cxx11_
          (result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  bool bVar1;
  int iVar2;
  type rollback;
  value_type *pvVar3;
  syntax_error *this_00;
  char *pcVar4;
  reference pcVar5;
  internal_error *piVar6;
  value_type *dt;
  location *loc_00;
  pair<toml::offset_datetime,_toml::detail::region> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ae8;
  bool local_9c1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9a8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98a;
  undefined1 local_989;
  source_location local_988;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_938;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_930;
  iterator local_8c0;
  size_type local_8b8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8b0;
  allocator<char> local_891;
  string local_890;
  string local_870;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  char *local_830;
  undefined4 local_828;
  undefined2 local_822;
  offset_datetime local_820;
  pair<toml::offset_datetime,_toml::detail::region> local_810;
  success<std::pair<toml::offset_datetime,_toml::detail::region>_> local_7b8;
  undefined1 local_759;
  source_location local_758;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_708;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6ea;
  undefined1 local_6e9;
  source_location local_6e8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_698;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_690;
  iterator local_620;
  size_type local_618;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_610;
  allocator<char> local_5f1;
  string local_5f0;
  string local_5d0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_5b0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_5a8;
  time_offset local_59d;
  time_offset local_59b;
  undefined1 local_599;
  source_location local_598;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_52a;
  undefined1 local_529;
  source_location local_528;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4d8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  iterator local_460;
  size_type local_458;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_450;
  allocator<char> local_431;
  string local_430;
  string local_410;
  string local_3f0;
  int local_3cc;
  undefined1 local_3c8 [4];
  int minute;
  int local_3a4;
  undefined1 local_3a0 [4];
  int hour;
  string str;
  result<toml::detail::region,_toml::detail::none_t> ofs;
  undefined1 local_328 [5];
  time_offset offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b2;
  undefined1 local_2b1;
  source_location local_2b0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  iterator local_1e8;
  size_type local_1e0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_178;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_170;
  undefined1 local_168 [8];
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  string local_d8;
  undefined1 local_b8 [8];
  location inner_loc;
  result<toml::detail::region,_toml::detail::none_t> token;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  location *loc_local;
  
  rollback = location::iter((location *)this);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>,_toml::detail::either<toml::detail::character<'T'>,_toml::detail::character<'t'>,_toml::detail::character<'_'>_>,_toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'.'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::at_least<1UL>_>_>_>_>,_toml::detail::either<toml::detail::character<'Z'>,_toml::detail::character<'z'>,_toml::detail::sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>_>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_,(location *)this);
  bVar1 = toml::result::operator_cast_to_bool((result *)&inner_loc.iter_);
  if (bVar1) {
    location::name_abi_cxx11_(&local_d8,(location *)this);
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
    region::str_abi_cxx11_((string *)&datetime.field_1.succ.value.second.last_,pvVar3);
    location::location((location *)local_b8,&local_d8,
                       (string *)&datetime.field_1.succ.value.second.last_);
    std::__cxx11::string::~string((string *)&datetime.field_1.succ.value.second.last_);
    std::__cxx11::string::~string((string *)&local_d8);
    parse_local_datetime_abi_cxx11_
              ((result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_168,(detail *)local_b8,loc_00);
    bVar1 = toml::result::operator_cast_to_bool((result *)local_168);
    local_9c1 = true;
    if (bVar1) {
      local_170._M_current = (char *)location::iter((location *)local_b8);
      local_178._M_current = (char *)location::end((location *)local_b8);
      local_9c1 = __gnu_cxx::operator==(&local_170,&local_178);
    }
    if (local_9c1 != false) {
      ofs.field_1._71_1_ = 1;
      piVar6 = (internal_error *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"toml::parse_offset_datetime: invalid datetime format",
                 &local_1b9);
      local_2b1 = 1;
      local_260 = &local_258;
      source_location::source_location(&local_2b0,(location *)local_b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                (&local_258,&local_2b0,(char (*) [19])"date, not datetime");
      local_2b1 = 0;
      local_1e8 = &local_258;
      local_1e0 = 1;
      std::
      allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_2b2);
      __l_02._M_len = local_1e0;
      __l_02._M_array = local_1e8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_1d8,__l_02,&local_2b2);
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2d8);
      format_underline(&local_198,&local_1b8,&local_1d8,&local_2d8,false);
      source_location::source_location((source_location *)local_328,(location *)local_b8);
      internal_error::internal_error(piVar6,&local_198,(source_location *)local_328);
      ofs.field_1._71_1_ = 0;
      __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    time_offset::time_offset
              ((time_offset *)((long)&ofs.field_1.succ.value.last_._M_current + 5),0,0);
    sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)((long)&str.field_2 + 8),
             (location *)local_b8);
    bVar1 = toml::result::operator_cast_to_bool((result *)(str.field_2._M_local_buf + 8));
    if (bVar1) {
      pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)
                          ((long)&str.field_2 + 8));
      region::str_abi_cxx11_((string *)local_3a0,pvVar3);
      std::__cxx11::string::substr((ulong)local_3c8,(ulong)local_3a0);
      iVar2 = from_string<int>((string *)local_3c8,0);
      std::__cxx11::string::~string((string *)local_3c8);
      local_3a4 = iVar2;
      std::__cxx11::string::substr((ulong)&local_3f0,(ulong)local_3a0);
      iVar2 = from_string<int>(&local_3f0,0);
      std::__cxx11::string::~string((string *)&local_3f0);
      local_3cc = iVar2;
      if ((((local_3a4 < 0) || (0x17 < local_3a4)) || (iVar2 < 0)) || (0x3b < iVar2)) {
        local_599 = 1;
        this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,
                   "toml::parse_offset_datetime: invalid offset: it does not conform RFC3339.",
                   &local_431);
        local_529 = 1;
        local_4d8 = &local_4d0;
        source_location::source_location(&local_528,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[78],_true>
                  (&local_4d0,&local_528,
                   (char (*) [78])
                   "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
        local_529 = 0;
        local_460 = &local_4d0;
        local_458 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_52a);
        __l_01._M_len = local_458;
        __l_01._M_array = local_460;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_450,__l_01,&local_52a);
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_548);
        format_underline(&local_410,&local_430,&local_450,&local_548,false);
        source_location::source_location(&local_598,(location *)local_b8);
        syntax_error::syntax_error(this_00,&local_410,&local_598);
        local_599 = 0;
        __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      pcVar4 = (char *)std::__cxx11::string::front();
      if (*pcVar4 == '+') {
        time_offset::time_offset(&local_59b,local_3a4,local_3cc);
        ofs.field_1._69_1_ = local_59b.hour;
        ofs.field_1._70_1_ = local_59b.minute;
      }
      else {
        time_offset::time_offset(&local_59d,-local_3a4,-local_3cc);
        ofs.field_1._69_1_ = local_59d.hour;
        ofs.field_1._70_1_ = local_59d.minute;
      }
      std::__cxx11::string::~string((string *)local_3a0);
    }
    else {
      local_5a8._M_current = (char *)location::iter((location *)local_b8);
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_5a8);
      bVar1 = false;
      if (*pcVar5 != 'Z') {
        local_5b0._M_current = (char *)location::iter((location *)local_b8);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_5b0);
        bVar1 = *pcVar5 != 'z';
      }
      if (bVar1) {
        local_759 = 1;
        piVar6 = (internal_error *)__cxa_allocate_exception(0x78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,"toml::parse_offset_datetime: invalid datetime format",
                   &local_5f1);
        local_6e9 = 1;
        local_698 = &local_690;
        source_location::source_location(&local_6e8,(location *)local_b8);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[26],_true>
                  (&local_690,&local_6e8,(char (*) [26])"should be `Z` or `+HH:MM`");
        local_6e9 = 0;
        local_620 = &local_690;
        local_618 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_6ea);
        __l_00._M_len = local_618;
        __l_00._M_array = local_620;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_610,__l_00,&local_6ea);
        local_708.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_708.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_708.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_708);
        format_underline(&local_5d0,&local_5f0,&local_610,&local_708,false);
        source_location::source_location(&local_758,(location *)local_b8);
        internal_error::internal_error(piVar6,&local_5d0,&local_758);
        local_759 = 0;
        __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
      }
    }
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)((long)&str.field_2 + 8));
    dt = result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::unwrap((result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_168);
    local_822 = ofs.field_1._69_2_;
    offset_datetime::offset_datetime(&local_820,&dt->first,(time_offset)ofs.field_1._69_2_);
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
    std::make_pair<toml::offset_datetime,toml::detail::region_const&>(&local_810,&local_820,pvVar3);
    ok<std::pair<toml::offset_datetime,toml::detail::region>>(&local_7b8,(toml *)&local_810,v);
    result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_7b8);
    success<std::pair<toml::offset_datetime,_toml::detail::region>_>::~success(&local_7b8);
    std::pair<toml::offset_datetime,_toml::detail::region>::~pair(&local_810);
    local_828 = 1;
    result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~result((result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_168);
    location::~location((location *)local_b8);
  }
  else {
    local_830 = rollback._M_current;
    location::reset((location *)this,(const_iterator)rollback._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"toml::parse_offset_datetime: ",&local_891);
    local_989 = 1;
    local_938 = &local_930;
    source_location::source_location(&local_988,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[40],_true>
              (&local_930,&local_988,(char (*) [40])"the next token is not a offset_datetime");
    local_989 = 0;
    local_8c0 = &local_930;
    local_8b8 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_98a);
    __l._M_len = local_8b8;
    __l._M_array = local_8c0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_8b0,__l,&local_98a);
    local_9a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_9a8);
    format_underline(&local_870,&local_890,&local_8b0,&local_9a8,false);
    err<std::__cxx11::string>(&local_850,(toml *)&local_870,v_00);
    result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_850);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_850);
    std::__cxx11::string::~string((string *)&local_870);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_9a8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_8b0);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_98a);
    local_ae8 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_8c0;
    do {
      local_ae8 = local_ae8 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_ae8);
    } while (local_ae8 != &local_930);
    source_location::~source_location(&local_988);
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator(&local_891);
    local_828 = 1;
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)&inner_loc.iter_);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<offset_datetime, region>, std::string>
parse_offset_datetime(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "date, not datetime"}}),
                source_location(inner_loc));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();

            const auto hour   = from_string<int>(str.substr(1,2), 0);
            const auto minute = from_string<int>(str.substr(4,2), 0);

            if((hour < 0 || 23 < hour) || (minute < 0 || 59 < minute))
            {
                throw syntax_error(format_underline("toml::parse_offset_datetime: "
                    "invalid offset: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }

            if(str.front() == '+')
            {
                offset = time_offset(hour, minute);
            }
            else
            {
                offset = time_offset(-hour, -minute);
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "should be `Z` or `+HH:MM`"}}),
                source_location(inner_loc));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_offset_datetime: ",
            {{source_location(loc), "the next token is not a offset_datetime"}}));
    }
}